

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::Expect(AsciiParser *this,char expect_c)

{
  int *piVar1;
  bool bVar2;
  ostream *poVar3;
  char c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream ss_e;
  
  bVar2 = SkipWhitespace(this);
  if ((bVar2) && (bVar2 = Char1(this,&c), bVar2)) {
    if (c == expect_c) {
      piVar1 = &(this->_curr_cursor).col;
      *piVar1 = *piVar1 + 1;
      return true;
    }
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    local_248._M_string_length = 1;
    local_248.field_2._M_local_buf[1] = '\0';
    local_248.field_2._M_local_buf[0] = expect_c;
    ::std::operator+(&local_1c8,"Expected `",&local_248);
    ::std::operator+(&local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8
                     ,"` but got `");
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    local_228.field_2._M_local_buf[0] = c;
    local_228._M_string_length = 1;
    local_228.field_2._M_local_buf[1] = '\0';
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208
                     ,&local_228);
    ::std::operator+(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e
                     ,"`\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"Expect");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x8f6);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&msg);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_208);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    ::std::__cxx11::string::_M_dispose();
    return false;
  }
  return false;
}

Assistant:

bool AsciiParser::Expect(char expect_c) {
  if (!SkipWhitespace()) {
    return false;
  }

  char c;
  if (!Char1(&c)) {
    // this should not happen.
    return false;
  }

  bool ret = (c == expect_c);

  if (!ret) {
    std::string msg = "Expected `" + std::string(&expect_c, 1) + "` but got `" +
                      std::string(&c, 1) + "`\n";
    PUSH_ERROR_AND_RETURN(msg);

    // unwind
    _sr->seek_from_current(-1);
  } else {
    _curr_cursor.col++;
  }

  return ret;
}